

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_fast_fourier_transform.h
# Opt level: O3

void __thiscall
sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform
          (RealValuedFastFourierTransform *this)

{
  ~RealValuedFastFourierTransform(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~RealValuedFastFourierTransform() {
  }